

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::Compressed2DFormatCase::iterate(Compressed2DFormatCase *this)

{
  int preferredHeight;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_02;
  char *description;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface referenceFrame;
  TextureFormatInfo spec;
  RandomViewport local_1a8;
  vector<float,_std::allocator<float>_> local_198;
  Surface local_178;
  TestLog *local_160;
  undefined1 *local_158;
  ConstPixelBufferAccess *local_150;
  Surface local_148;
  PixelBufferAccess local_130;
  ReferenceParams local_104;
  TextureFormatInfo local_70;
  long lVar5;
  undefined4 extraout_var_01;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_160 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = (this->m_texture->m_refTexture).m_width;
  preferredHeight = (this->m_texture->m_refTexture).m_height;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_1a8,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,preferredHeight,dVar4)
  ;
  tcu::Surface::Surface(&local_178,local_1a8.width,local_1a8.height);
  tcu::Surface::Surface(&local_148,local_1a8.width,local_1a8.height);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var_01,iVar2);
  uVar9 = 0x1000000 << (8U - (char)*(int *)(lVar6 + 0x14) & 0x1f);
  bVar8 = 8 - *(char *)(lVar6 + 8);
  if (*(int *)(lVar6 + 0x14) < 1) {
    uVar9 = 0;
  }
  uVar11 = 0x100 << (8U - *(char *)(lVar6 + 0xc) & 0x1f) | 1 << (bVar8 & 0x1f);
  uVar9 = 0x10000 << (8U - *(char *)(lVar6 + 0x10) & 0x1f) | uVar11 | uVar9;
  uVar10 = 1 << (bVar8 & 0x1f) & 0xff;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  uVar11 = uVar11 >> 8 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar7 = uVar9 >> 0x10 & 0xff;
  if (0xfd < uVar7) {
    uVar7 = 0xfe;
  }
  uVar9 = uVar9 >> 0x18;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_104,TEXTURETYPE_2D);
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&this->m_texture->m_refTexture);
  local_104.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_104.sampler.wrapS = CLAMP_TO_EDGE;
  local_104.sampler.wrapT = CLAMP_TO_EDGE;
  local_104.sampler.wrapR = CLAMP_TO_EDGE;
  local_104.sampler.minFilter = NEAREST;
  local_104.sampler.magFilter = NEAREST;
  local_104.sampler.lodThreshold = 0.0;
  local_104.sampler.normalizedCoords = true;
  local_104.sampler.compare = COMPAREMODE_NONE;
  local_104.sampler.compareChannel = 0;
  local_104.sampler.borderColor.v._0_8_ = 0;
  local_104.sampler.borderColor.v._8_8_ = 0;
  local_104.sampler.seamlessCubeMap = false;
  local_104.sampler._53_3_ = 0;
  local_104.sampler.depthStencilMode = MODE_DEPTH;
  local_104.super_RenderParams.colorScale.m_data[0] = local_70.lookupScale.m_data[0];
  local_104.super_RenderParams.colorScale.m_data[1] = local_70.lookupScale.m_data[1];
  local_104.super_RenderParams.colorScale.m_data[2] = local_70.lookupScale.m_data[2];
  local_104.super_RenderParams.colorScale.m_data[3] = local_70.lookupScale.m_data[3];
  local_104.super_RenderParams.colorBias.m_data[0] = local_70.lookupBias.m_data[0];
  local_104.super_RenderParams.colorBias.m_data[1] = local_70.lookupBias.m_data[1];
  local_104.super_RenderParams.colorBias.m_data[2] = local_70.lookupBias.m_data[2];
  local_104.super_RenderParams.colorBias.m_data[3] = local_70.lookupBias.m_data[3];
  local_130.super_ConstPixelBufferAccess.m_format.order = R;
  local_130.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_158 = &DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_198,(Vec2 *)&local_130,(Vec2 *)&local_158);
  (**(code **)(lVar5 + 0x1a00))(local_1a8.x,local_1a8.y,local_1a8.width,local_1a8.height);
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x345);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_104.super_RenderParams);
  context = this->m_renderCtx;
  local_158 = (undefined1 *)0x300000008;
  if ((void *)local_178.m_pixels.m_cap != (void *)0x0) {
    local_178.m_pixels.m_cap = (size_t)local_178.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_130,(TextureFormat *)&local_158,local_178.m_width,local_178.m_height,1,
             (void *)local_178.m_pixels.m_cap);
  glu::readPixels(context,local_1a8.x,local_1a8.y,&local_130);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_130,&local_148,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8));
  local_150 = (this->m_texture->m_refTexture).m_view.m_levels;
  local_158 = (undefined1 *)
              CONCAT44(local_158._4_4_,(this->m_texture->m_refTexture).m_view.m_numLevels);
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&local_130,(Texture2DView *)&local_158,
             local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_104);
  bVar1 = glu::TextureTestUtil::compareImages
                    (local_160,&local_148,&local_178,
                     (RGBA)(uVar9 * 0x1000000 + (uVar7 << 0x10 | uVar11 * 0x100 + uVar10) +
                           0x1010101));
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar1,description);
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_148);
  tcu::Surface::~Surface(&local_178);
  return STOP;
}

Assistant:

Compressed2DFormatCase::IterateResult Compressed2DFormatCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight(), deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_2D);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	renderParams.samplerType	= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}